

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v3.cpp
# Opt level: O0

ssize_t __thiscall
LASwriteItemCompressed_RGB14_v3::write
          (LASwriteItemCompressed_RGB14_v3 *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint sym_00;
  int iVar7;
  undefined4 in_register_00000034;
  ushort *puVar8;
  U32 local_f8;
  U32 local_f4;
  byte local_de;
  byte local_dd;
  U32 local_d8;
  U32 local_d4;
  byte local_be;
  byte local_bd;
  U32 local_b8;
  U32 local_b4;
  byte local_9e;
  byte local_9d;
  U32 local_98;
  U32 local_94;
  byte local_7e;
  byte local_7d;
  U32 local_78;
  U32 local_74;
  U32 local_60;
  U32 local_5c;
  bool local_41;
  U32 sym;
  I32 corr;
  I32 diff_h;
  I32 diff_l;
  U16 *last_item;
  U32 *context_local;
  U8 *item_local;
  LASwriteItemCompressed_RGB14_v3 *this_local;
  
  puVar8 = (ushort *)CONCAT44(in_register_00000034,__fd);
  _diff_h = this->contexts[this->current_context].last_item;
  if ((this->current_context != *__buf) &&
     (this->current_context = *__buf, (this->contexts[this->current_context].unused & 1U) != 0)) {
    createAndInitModelsAndCompressors(this,this->current_context,(U8 *)_diff_h);
    _diff_h = this->contexts[this->current_context].last_item;
  }
  corr = 0;
  sym = 0;
  uVar6 = (uint)((*_diff_h & 0xff) != (*puVar8 & 0xff));
  uVar1 = (uint)((*_diff_h & 0xff00) != (*puVar8 & 0xff00));
  uVar2 = (uint)((_diff_h[1] & 0xff) != (puVar8[1] & 0xff));
  uVar3 = (uint)((_diff_h[1] & 0xff00) != (puVar8[1] & 0xff00));
  uVar4 = (uint)((_diff_h[2] & 0xff) != (puVar8[2] & 0xff));
  uVar5 = (uint)((_diff_h[2] & 0xff00) != (puVar8[2] & 0xff00));
  local_41 = true;
  if ((((*puVar8 & 0xff) == (puVar8[1] & 0xff)) &&
      (local_41 = true, (*puVar8 & 0xff) == (puVar8[2] & 0xff))) &&
     (local_41 = true, (*puVar8 & 0xff00) == (puVar8[1] & 0xff00))) {
    local_41 = (*puVar8 & 0xff00) != (puVar8[2] & 0xff00);
  }
  sym_00 = (uint)local_41 << 6 |
           uVar5 << 5 | uVar4 << 4 | uVar3 << 3 | uVar2 << 2 | uVar1 << 1 | uVar6;
  ArithmeticEncoder::encodeSymbol
            (this->enc_RGB,this->contexts[this->current_context].m_byte_used,sym_00);
  if (uVar6 != 0) {
    corr = (*puVar8 & 0xff) - (*_diff_h & 0xff);
    if (corr < 0) {
      local_5c = corr + 0x100;
    }
    else {
      local_60 = corr;
      if (0xff < corr) {
        local_60 = corr - 0x100;
      }
      local_5c = local_60;
    }
    ArithmeticEncoder::encodeSymbol
              (this->enc_RGB,this->contexts[this->current_context].m_rgb_diff_0,local_5c);
  }
  if (uVar1 != 0) {
    sym = ((int)(uint)*puVar8 >> 8) - ((int)(uint)*_diff_h >> 8);
    if ((int)sym < 0) {
      local_74 = sym + 0x100;
    }
    else {
      local_78 = sym;
      if (0xff < (int)sym) {
        local_78 = sym - 0x100;
      }
      local_74 = local_78;
    }
    ArithmeticEncoder::encodeSymbol
              (this->enc_RGB,this->contexts[this->current_context].m_rgb_diff_1,local_74);
  }
  if (local_41 != 0) {
    if (uVar2 != 0) {
      if ((int)(corr + (_diff_h[1] & 0xff)) < 1) {
        local_7d = 0;
      }
      else {
        if ((int)(corr + (_diff_h[1] & 0xff)) < 0xff) {
          local_7e = (char)corr + (char)_diff_h[1];
        }
        else {
          local_7e = 0xff;
        }
        local_7d = local_7e;
      }
      local_98 = (puVar8[1] & 0xff) - (uint)local_7d;
      if ((int)local_98 < 0) {
        local_94 = local_98 + 0x100;
      }
      else {
        if (0xff < (int)local_98) {
          local_98 = local_98 - 0x100;
        }
        local_94 = local_98;
      }
      ArithmeticEncoder::encodeSymbol
                (this->enc_RGB,this->contexts[this->current_context].m_rgb_diff_2,local_94);
    }
    if (uVar4 != 0) {
      iVar7 = (int)((corr + (puVar8[1] & 0xff)) - (_diff_h[1] & 0xff)) / 2;
      if ((int)(iVar7 + (_diff_h[2] & 0xff)) < 1) {
        local_9d = 0;
      }
      else {
        if ((int)(iVar7 + (_diff_h[2] & 0xff)) < 0xff) {
          local_9e = (char)iVar7 + (char)_diff_h[2];
        }
        else {
          local_9e = 0xff;
        }
        local_9d = local_9e;
      }
      local_b8 = (puVar8[2] & 0xff) - (uint)local_9d;
      if ((int)local_b8 < 0) {
        local_b4 = local_b8 + 0x100;
      }
      else {
        if (0xff < (int)local_b8) {
          local_b8 = local_b8 - 0x100;
        }
        local_b4 = local_b8;
      }
      ArithmeticEncoder::encodeSymbol
                (this->enc_RGB,this->contexts[this->current_context].m_rgb_diff_4,local_b4);
    }
    if (uVar3 != 0) {
      if ((int)(sym + ((int)(uint)_diff_h[1] >> 8)) < 1) {
        local_bd = 0;
      }
      else {
        if ((int)(sym + ((int)(uint)_diff_h[1] >> 8)) < 0xff) {
          local_be = (char)sym + (char)(_diff_h[1] >> 8);
        }
        else {
          local_be = 0xff;
        }
        local_bd = local_be;
      }
      local_d8 = ((int)(uint)puVar8[1] >> 8) - (uint)local_bd;
      if ((int)local_d8 < 0) {
        local_d4 = local_d8 + 0x100;
      }
      else {
        if (0xff < (int)local_d8) {
          local_d8 = local_d8 - 0x100;
        }
        local_d4 = local_d8;
      }
      ArithmeticEncoder::encodeSymbol
                (this->enc_RGB,this->contexts[this->current_context].m_rgb_diff_3,local_d4);
    }
    if (uVar5 != 0) {
      iVar7 = (int)((sym + ((int)(uint)puVar8[1] >> 8)) - ((int)(uint)_diff_h[1] >> 8)) / 2;
      if (iVar7 + ((int)(uint)_diff_h[2] >> 8) < 1) {
        local_dd = 0;
      }
      else {
        if (iVar7 + ((int)(uint)_diff_h[2] >> 8) < 0xff) {
          local_de = (char)iVar7 + (char)(_diff_h[2] >> 8);
        }
        else {
          local_de = 0xff;
        }
        local_dd = local_de;
      }
      local_f8 = ((int)(uint)puVar8[2] >> 8) - (uint)local_dd;
      if ((int)local_f8 < 0) {
        local_f4 = local_f8 + 0x100;
      }
      else {
        if (0xff < (int)local_f8) {
          local_f8 = local_f8 - 0x100;
        }
        local_f4 = local_f8;
      }
      ArithmeticEncoder::encodeSymbol
                (this->enc_RGB,this->contexts[this->current_context].m_rgb_diff_5,local_f4);
    }
  }
  if (sym_00 != 0) {
    this->changed_RGB = true;
  }
  *(undefined4 *)_diff_h = *(undefined4 *)puVar8;
  _diff_h[2] = puVar8[2];
  return CONCAT71((int7)((ulong)_diff_h >> 8),1);
}

Assistant:

inline BOOL LASwriteItemCompressed_RGB14_v3::write(const U8* item, U32& context)
{
  // get last

  U16* last_item = contexts[current_context].last_item;

  // check for context switch

  if (current_context != context)
  {
    current_context = context; // all other items use context set by POINT14 writer
    if (contexts[current_context].unused)
    {
      createAndInitModelsAndCompressors(current_context, (U8*)last_item);
      last_item = contexts[current_context].last_item;
    }
  }

  // compress

  I32 diff_l = 0;
  I32 diff_h = 0;
  I32 corr;
  U32 sym = ((last_item[0]&0x00FF) != (((const U16*)item)[0]&0x00FF)) << 0;
  sym |= ((last_item[0]&0xFF00) != (((const U16*)item)[0]&0xFF00)) << 1;
  sym |= ((last_item[1]&0x00FF) != (((const U16*)item)[1]&0x00FF)) << 2;
  sym |= ((last_item[1]&0xFF00) != (((const U16*)item)[1]&0xFF00)) << 3;
  sym |= ((last_item[2]&0x00FF) != (((const U16*)item)[2]&0x00FF)) << 4;
  sym |= ((last_item[2]&0xFF00) != (((const U16*)item)[2]&0xFF00)) << 5;
  sym |= (((((const U16*)item)[0]&0x00FF) != (((const U16*)item)[1]&0x00FF)) || ((((const U16*)item)[0]&0x00FF) != (((const U16*)item)[2]&0x00FF)) || ((((const U16*)item)[0]&0xFF00) != (((const U16*)item)[1]&0xFF00)) || ((((const U16*)item)[0]&0xFF00) != (((const U16*)item)[2]&0xFF00))) << 6;
  enc_RGB->encodeSymbol(contexts[current_context].m_byte_used, sym);
  if (sym & (1 << 0))
  {
    diff_l = ((int)(((const U16*)item)[0]&255)) - (last_item[0]&255);
    enc_RGB->encodeSymbol(contexts[current_context].m_rgb_diff_0, U8_FOLD(diff_l));
  }
  if (sym & (1 << 1))
  {
    diff_h = ((int)(((const U16*)item)[0]>>8)) - (last_item[0]>>8);
    enc_RGB->encodeSymbol(contexts[current_context].m_rgb_diff_1, U8_FOLD(diff_h));
  }
  if (sym & (1 << 6))
  {
    if (sym & (1 << 2))
    {
      corr = ((int)(((const U16*)item)[1]&255)) - U8_CLAMP(diff_l + (last_item[1]&255));
      enc_RGB->encodeSymbol(contexts[current_context].m_rgb_diff_2, U8_FOLD(corr));
    }
    if (sym & (1 << 4))
    {
      diff_l = (diff_l + (((const U16*)item)[1]&255) - (last_item[1]&255)) / 2;
      corr = ((int)(((const U16*)item)[2]&255)) - U8_CLAMP(diff_l + (last_item[2]&255));
      enc_RGB->encodeSymbol(contexts[current_context].m_rgb_diff_4, U8_FOLD(corr));
    }
    if (sym & (1 << 3))
    {
      corr = ((int)(((const U16*)item)[1]>>8)) - U8_CLAMP(diff_h + (last_item[1]>>8));
      enc_RGB->encodeSymbol(contexts[current_context].m_rgb_diff_3, U8_FOLD(corr));
    }
    if (sym & (1 << 5))
    {
      diff_h = (diff_h + (((const U16*)item)[1]>>8) - (last_item[1]>>8)) / 2;
      corr = ((int)(((const U16*)item)[2]>>8)) - U8_CLAMP(diff_h + (last_item[2]>>8));
      enc_RGB->encodeSymbol(contexts[current_context].m_rgb_diff_5, U8_FOLD(corr));
    }
  }
  if (sym)
  {
    changed_RGB = TRUE;
  }
  memcpy(last_item, item, 6);

  return TRUE;
}